

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

void __thiscall glcts::IntegerConstant::IntegerConstant(IntegerConstant *this,Literals lit,int ai)

{
  ostream *poVar1;
  uint uVar2;
  char *pcVar3;
  StringStream s;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [112];
  undefined **local_130 [27];
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  (this->asString)._M_dataplus._M_p = (pointer)&(this->asString).field_2;
  (this->asString)._M_string_length = 0;
  (this->asString).field_2._M_local_buf[0] = '\0';
  this->asInt = ai;
  std::ios_base::ios_base((ios_base *)local_130);
  local_130[0] = (undefined **)glUniformMatrix3x2fv;
  local_58 = 0;
  local_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  local_1a0._0_8_ = &PTR__StringStream_020fda68;
  local_130[0] = &PTR__StringStream_020fda90;
  pcVar3 = "0x";
  switch(lit) {
  case decimal:
    goto switchD_00bd74f0_caseD_0;
  case decimal_u:
    goto switchD_00bd74f0_caseD_1;
  case decimal_U:
    goto switchD_00bd74f0_caseD_2;
  case octal:
    uVar2 = 0x40;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"0",1);
    break;
  case octal_u:
    uVar2 = 0x40;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"0",1);
    goto LAB_00bd756a;
  case octal_U:
    uVar2 = 0x40;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"0",1);
    goto LAB_00bd75f6;
  case hex_X:
    pcVar3 = "0X";
  case hex_x:
    uVar2 = 8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,2);
    break;
  case hex_u_X:
    pcVar3 = "0X";
  case hex_u:
    uVar2 = 8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,2);
LAB_00bd756a:
    *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) =
         *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) & 0xffffffb5
         | uVar2;
switchD_00bd74f0_caseD_1:
    poVar1 = (ostream *)std::ostream::operator<<(local_1a0,this->asInt);
    pcVar3 = "u";
LAB_00bd7621:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,1);
    goto switchD_00bd74f0_default;
  case hex_U_X:
    pcVar3 = "0X";
  case hex_U:
    uVar2 = 8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,2);
LAB_00bd75f6:
    *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) =
         *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) & 0xffffffb5
         | uVar2;
switchD_00bd74f0_caseD_2:
    poVar1 = (ostream *)std::ostream::operator<<(local_1a0,this->asInt);
    pcVar3 = "U";
    goto LAB_00bd7621;
  default:
    goto switchD_00bd74f0_default;
  }
  *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) & 0xffffffb5 |
       uVar2;
switchD_00bd74f0_caseD_0:
  std::ostream::operator<<(local_1a0,this->asInt);
switchD_00bd74f0_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)local_130);
  return;
}

Assistant:

IntegerConstant(Literals lit, int ai) : asInt(ai)
	{
		StringStream s;
		switch (lit)
		{
		case decimal:
			s << asInt;
			break;
		case decimal_u:
			s << asInt << "u";
			break;
		case decimal_U:
			s << asInt << "U";
			break;
		case octal:
			s << "0" << std::oct << asInt;
			break;
		case octal_u:
			s << "0" << std::oct << asInt << "u";
			break;
		case octal_U:
			s << "0" << std::oct << asInt << "U";
			break;
		case hex_x:
			s << "0x" << std::hex << asInt;
			break;
		case hex_X:
			s << "0X" << std::hex << asInt;
			break;
		case hex_u:
			s << "0x" << std::hex << asInt << "u";
			break;
		case hex_u_X:
			s << "0X" << std::hex << asInt << "u";
			break;
		case hex_U:
			s << "0x" << std::hex << asInt << "U";
			break;
		case hex_U_X:
			s << "0X" << std::hex << asInt << "U";
			break;
		case last:
		default:
			DE_ASSERT(0);
		}

		asString = s.str();
	}